

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void __thiscall Null::Encode(Null *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  overflow_error *this_00;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  Null *this_local;
  
  if (cbOut < 2) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"Overflow in Null::Encode");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  *pOut = '\x05';
  pOut[1] = '\0';
  *cbUsed = 2;
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
	{
		if(cbOut < 2)
			throw std::overflow_error("Overflow in Null::Encode");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
	}